

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Netlist.h
# Opt level: O1

NetlistVariableDeclaration * __thiscall
netlist::Netlist::lookupVariable(Netlist *this,string_view hierarchicalPath)

{
  pointer puVar1;
  bool bVar2;
  NetlistVariableDeclaration *pNVar3;
  pointer puVar4;
  size_t *local_38;
  size_t local_30;
  char *local_28;
  
  local_28 = hierarchicalPath._M_str;
  local_30 = hierarchicalPath._M_len;
  local_38 = &local_30;
  puVar4 = (this->super_DirectedGraph<netlist::NetlistNode,_netlist::NetlistEdge>).nodes.
           super__Vector_base<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>,_std::allocator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->super_DirectedGraph<netlist::NetlistNode,_netlist::NetlistEdge>).nodes.
           super__Vector_base<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>,_std::allocator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while ((puVar4 != puVar1 &&
         (bVar2 = std::
                  __invoke_impl<bool,netlist::Netlist::lookupVariable(std::basic_string_view<char,std::char_traits<char>>)::_lambda(std::unique_ptr<netlist::NetlistNode,std::default_delete<netlist::NetlistNode>>const&)_1_&,std::unique_ptr<netlist::NetlistNode,std::default_delete<netlist::NetlistNode>>&>
                            (&local_38,puVar4), !bVar2))) {
    puVar4 = puVar4 + 1;
  }
  if (puVar4 == (this->super_DirectedGraph<netlist::NetlistNode,_netlist::NetlistEdge>).nodes.
                super__Vector_base<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>,_std::allocator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    pNVar3 = (NetlistVariableDeclaration *)0x0;
  }
  else {
    pNVar3 = (NetlistVariableDeclaration *)
             (puVar4->_M_t).
             super___uniq_ptr_impl<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>
             ._M_t.
             super__Tuple_impl<0UL,_netlist::NetlistNode_*,_std::default_delete<netlist::NetlistNode>_>
             .super__Head_base<0UL,_netlist::NetlistNode_*,_false>._M_head_impl;
  }
  return pNVar3;
}

Assistant:

NetlistVariableDeclaration* lookupVariable(std::string_view hierarchicalPath) {
        auto compareNode = [&hierarchicalPath](const std::unique_ptr<NetlistNode>& node) {
            return node->kind == NodeKind::VariableDeclaration &&
                   node->as<NetlistVariableDeclaration>().hierarchicalPath == hierarchicalPath;
        };
        auto it = std::ranges::find_if(*this, compareNode);
        return it != end() ? &it->get()->as<NetlistVariableDeclaration>() : nullptr;
    }